

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MaxDistanceShapeIndexTarget::VisitContainingShapes
          (S2MaxDistanceShapeIndexTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  int iVar8;
  ShapeIterator it;
  S2MaxDistancePointTarget target;
  ReferencePoint ref;
  ShapeIterator local_98;
  S2ShapeIndex *local_88;
  S2MaxDistancePointTarget local_80;
  VType local_60;
  VType VStack_58;
  VType local_50;
  char local_48;
  long *plVar6;
  
  local_98.index_ = this->index_;
  local_98.shape_id_ = 0;
  local_88 = local_98.index_;
  iVar4 = (*(local_98.index_)->_vptr_S2ShapeIndex[2])();
  while( true ) {
    it.shape_id_ = iVar4;
    it.index_ = local_88;
    it._12_4_ = 0;
    bVar1 = S2ShapeIndex::ShapeIterator::operator!=(&local_98,it);
    if (!bVar1) break;
    iVar5 = (*(local_98.index_)->_vptr_S2ShapeIndex[3])
                      (local_98.index_,(ulong)(uint)local_98.shape_id_);
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    if (plVar6 != (long *)0x0) {
      iVar5 = (**(code **)(*plVar6 + 0x30))(plVar6);
      bVar3 = false;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
        uVar7 = (**(code **)(*plVar6 + 0x38))(plVar6,iVar8);
        if (uVar7 >> 0x20 != 0) {
          (**(code **)(*plVar6 + 0x40))(&local_60,plVar6,iVar8,0);
          local_80.super_S2MaxDistanceTarget._vptr_S2DistanceTarget =
               (_func_int **)&PTR__S2DistanceTarget_003056a8;
          local_80.point_.c_[2] = local_50;
          local_80.point_.c_[0] = local_60;
          local_80.point_.c_[1] = VStack_58;
          bVar2 = S2MaxDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor);
          bVar3 = true;
          if (!bVar2) goto LAB_00240b48;
        }
      }
      if (!bVar3) {
        (**(code **)(*plVar6 + 0x28))(&local_60,plVar6);
        if (local_48 == '\x01') {
          local_80.super_S2MaxDistanceTarget._vptr_S2DistanceTarget =
               (_func_int **)&PTR__S2DistanceTarget_003056a8;
          local_80.point_.c_[2] = local_50;
          local_80.point_.c_[0] = local_60;
          local_80.point_.c_[1] = VStack_58;
          bVar3 = S2MaxDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor);
          if (!bVar3) break;
        }
      }
    }
    local_98.shape_id_ = local_98.shape_id_ + 1;
  }
LAB_00240b48:
  return !bVar1;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  // It is sufficient to find the set of chain starts in the target index
  // (i.e., one vertex per connected component of edges) that are contained by
  // the query index, except for one special case to handle full polygons.
  //
  // TODO(ericv): Do this by merge-joining the two S2ShapeIndexes, and share
  // the code with S2BooleanOperation.
  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_chains = shape->num_chains();
    // Shapes that don't have any edges require a special case (below).
    bool tested_point = false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain chain = shape->chain(c);
      if (chain.length == 0) continue;
      tested_point = true;
      S2MaxDistancePointTarget target(shape->chain_edge(c, 0).v0);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
    if (!tested_point) {
      // Special case to handle full polygons.
      S2Shape::ReferencePoint ref = shape->GetReferencePoint();
      if (!ref.contained) continue;
      S2MaxDistancePointTarget target(ref.point);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
  }
  return true;
}